

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

int Gla_ManTranslate_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vGla,int nUsageCount)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = 1;
    if (p->pTravIds[iVar2] != p->nTravIds) {
      p->pTravIds[iVar2] = p->nTravIds;
      uVar4 = (uint)*(undefined8 *)pObj;
      uVar5 = 0;
      if ((~uVar4 & 0x9fffffff) != 0) {
        if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x499,
                        "int Gla_ManTranslate_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
        }
        iVar2 = Gla_ManTranslate_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff),vGla,nUsageCount);
        iVar3 = Gla_ManTranslate_rec
                          (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vGla,
                           nUsageCount);
        if (iVar3 != 0 || iVar2 != 0) {
          pGVar1 = p->pObjs;
          if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_006010e4;
          uVar5 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
          if (((int)uVar5 < 0) || (vGla->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          vGla->pArray[uVar5 & 0x7fffffff] = vGla->pArray[uVar5 & 0x7fffffff] + nUsageCount;
        }
        uVar5 = (uint)(iVar3 != 0 || iVar2 != 0);
      }
    }
    return uVar5;
  }
LAB_006010e4:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gla_ManTranslate_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vGla, int nUsageCount )
{
    int Value0, Value1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Gla_ManTranslate_rec( p, Gia_ObjFanin0(pObj), vGla, nUsageCount );
    Value1 = Gla_ManTranslate_rec( p, Gia_ObjFanin1(pObj), vGla, nUsageCount );
    if ( Value0 || Value1 )
        Vec_IntAddToEntry( vGla, Gia_ObjId(p, pObj), nUsageCount );
    return Value0 || Value1;
}